

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::recomputeSurpluses<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this)

{
  MultiIndexSet *mset;
  double dVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  pointer piVar5;
  pointer piVar6;
  uint uVar7;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int k;
  ulong uVar16;
  int iVar17;
  bool is_complete;
  vector<int,_std::allocator<int>_> vpntr;
  Data2D<int> dagUp;
  vector<int,_std::allocator<int>_> vindx;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  lines1d;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  map;
  vector<double,_std::allocator<double>_> vvals;
  bool local_159;
  _Vector_base<double,_std::allocator<double>_> local_158;
  uint local_13c;
  pointer local_138;
  size_t local_130;
  pointer local_128;
  long local_120;
  pointer local_118;
  long local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  long local_f0;
  pointer local_e8;
  pointer local_e0;
  long local_d8;
  Data2D<double> local_d0;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_88;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  iVar2 = (this->super_BaseCanonicalGrid).num_outputs;
  iVar14 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  ::std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&local_158,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (this->super_BaseCanonicalGrid).values.values.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                       )(this->super_BaseCanonicalGrid).values.values.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish,(allocator_type *)&local_a8);
  local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_158._M_impl.super__Vector_impl_data._M_start;
  local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_158._M_impl.super__Vector_impl_data._M_finish;
  local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_158._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.stride = (long)iVar2;
  local_d0.num_strips = (long)iVar14;
  Data2D<double>::operator=(&this->surpluses,&local_d0);
  mset = &(this->super_BaseCanonicalGrid).points;
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_d0.vec.super__Vector_base<double,_std::allocator<double>_>);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_158);
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  if ((iVar2 < 3) ||
     ((iVar2 == 3 && (2000000 < (this->super_BaseCanonicalGrid).points.cache_num_indexes)))) {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>
              ((Data2D<int> *)&local_d0,mset);
    HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>
              ((vector<int,_std::allocator<int>_> *)&local_158,mset);
    updateSurpluses<(TasGrid::RuleLocal::erule)3>
              (this,mset,this->top_level,(vector<int,_std::allocator<int>_> *)&local_158,
               (Data2D<int> *)&local_d0);
  }
  else {
    local_159 = true;
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>
              ((Data2D<int> *)&local_d0,mset,&local_159);
    if (local_159 == false) {
      HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>
                ((vector<int,_std::allocator<int>_> *)&local_158,mset);
      updateSurpluses<(TasGrid::RuleLocal::erule)3>
                (this,mset,this->top_level,(vector<int,_std::allocator<int>_> *)&local_158,
                 (Data2D<int> *)&local_d0);
    }
    else {
      _Var8 = ::std::
              __max_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((this->super_BaseCanonicalGrid).points.indexes.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->super_BaseCanonicalGrid).points.indexes.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      RuleLocal::van_matrix<(TasGrid::RuleLocal::erule)3>
                (this->order,*_Var8._M_current + 1,(vector<int,_std::allocator<int>_> *)&local_158,
                 (vector<int,_std::allocator<int>_> *)&local_a8,
                 (vector<double,_std::allocator<double>_> *)&local_48);
      local_68.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MultiIndexManipulations::resortIndexes(mset,&local_68,&local_88);
      uVar9 = (ulong)(uint)(this->super_BaseCanonicalGrid).num_dimensions;
      local_128 = local_88.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      while (0 < (int)uVar9) {
        uVar9 = uVar9 - 1;
        local_110 = uVar9 * 0x18;
        local_118 = local_88.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar9].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
        uVar12 = (int)((ulong)((long)local_88.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)local_118) >> 2) - 1;
        if ((int)uVar12 < 1) {
          uVar12 = 0;
        }
        local_100 = (ulong)uVar12;
        local_120 = uVar9 * 4;
        uVar11 = 0;
        while (local_108 = uVar9, uVar11 != local_100) {
          local_13c = local_118[uVar11];
          local_d8 = (long)local_118[uVar11 + 1];
          uVar11 = uVar11 + 1;
          local_e0 = local_68.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar9;
          sVar4 = (this->super_BaseCanonicalGrid).points.num_dimensions;
          local_130 = (this->surpluses).stride;
          local_138 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          piVar5 = (this->super_BaseCanonicalGrid).points.indexes.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          local_e8 = local_158._M_impl.super__Vector_impl_data._M_start;
          local_f0 = (long)(int)local_13c;
          lVar15 = local_f0;
LAB_001934a3:
          lVar15 = lVar15 + 1;
          local_f8 = uVar11;
          if (lVar15 < local_d8) {
            piVar6 = (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar13 = local_130 * (long)piVar6[lVar15];
            iVar2 = piVar5[uVar9 + (long)piVar6[lVar15] * sVar4];
            iVar14 = *(int *)((long)local_158._M_impl.super__Vector_impl_data._M_start +
                             (long)iVar2 * 4);
            iVar17 = piVar5[uVar9 + (long)piVar6[local_f0] * sVar4];
            uVar12 = (this->super_BaseCanonicalGrid).num_outputs;
            if ((int)uVar12 < 1) {
              uVar12 = 0;
            }
            uVar10 = (ulong)local_13c;
            do {
              iVar3 = local_a8._M_impl.super__Vector_impl_data._M_start[iVar14];
              uVar10 = (ulong)(int)uVar10;
              while( true ) {
                if ((iVar2 <= iVar3) && (iVar2 <= iVar17)) goto LAB_001934a3;
                if (iVar3 < iVar17) goto LAB_0019359d;
                if (iVar3 <= iVar17) break;
                uVar10 = uVar10 + 1;
                iVar17 = piVar5[uVar9 + (long)piVar6[(int)uVar10] * sVar4];
              }
              iVar17 = piVar6[uVar10];
              dVar1 = local_48._M_impl.super__Vector_impl_data._M_start[iVar14];
              for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
                local_138[lVar13 + uVar16] =
                     local_138[(long)iVar17 * local_130 + uVar16] * -dVar1 +
                     local_138[lVar13 + uVar16];
              }
              uVar7 = (int)uVar10 + 1;
              uVar10 = (ulong)uVar7;
              iVar17 = piVar5[uVar9 + (long)piVar6[(int)uVar7] * sVar4];
LAB_0019359d:
              iVar14 = iVar14 + 1;
            } while( true );
          }
        }
      }
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_88);
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_68);
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
    }
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_158);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_d0.vec);
  return;
}

Assistant:

void GridLocalPolynomial::recomputeSurpluses() {
    surpluses = Data2D<double>(num_outputs, points.getNumIndexes(), std::vector<double>(values.begin(), values.end()));

    // There are two available algorithms here:
    // - global sparse Kronecker (kron), implemented here in recomputeSurpluses()
    // - sparse matrix in matrix-free form (mat), implemented in updateSurpluses()
    //
    // (kron) has the additional restriction that it will only work when the hierarchy is complete
    // i.e., all point (multi-indexes) have all of their parents
    // this is guaranteed for a full-tensor grid, non-adaptive grid, or a grid adapted with the stable refinement strategy
    // other refinement strategies or using dynamic refinement (even with a stable refinement strategy)
    // may yield a hierarchy-complete grid, but this is not mathematically guaranteed
    //
    // computing the dagUp allows us to check (at runtime) if the grid is_complete, and exclude (kron) if incomplete
    //    the completeness check can be done on the fly but it does incur cost
    //
    // approximate computational cost, let n be the number of points and d be the number of dimensions
    // (kron) d n n^(1/d) due to standard Kronecker reasons, except it is hard to find the "effective" n due to sparsity
    // (mat) d^2 n log(n) since there are d log(n) ancestors and basis functions are product of d one dimensional functions
    //    naturally, there are constants and those also depend on the system, e.g., number of threads, thread scheduling, cache ...
    //    (mat) has a more even load per thread and parallelizes better
    //
    // for d = 1, the algorithms are the same, except (kron) explicitly forms the matrix and the matrix free (mat) version is much better
    // for d = 2, the (mat) algorithm is still faster
    // for d = 3, and sufficiently large size the (mat) algorithm still wins
    //            the breaking point depends on n, the order and system
    // for d = 4 and above, the (kron) algorithm is much faster
    //           it is possible that for sufficiently large n (mat) will win again
    //           but tested on 12 cores CPUs (Intel and AMD) up to n = 3.5 million, the (kron) method is over 2x faster
    // higher dimensions will favor (kron) even more

    if (num_dimensions <= 2 or (num_dimensions == 3 and points.getNumIndexes() > 2000000)) {
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);
        std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(points);
        updateSurpluses<effrule>(points, top_level, level, dagUp);
        return;
    }

    bool is_complete = true;
    Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points, is_complete);

    if (not is_complete) {
        // incomplete hierarchy, must use the slow algorithm
        std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(points);
        updateSurpluses<effrule>(points, top_level, level, dagUp);
        return;
    }

    int num_nodes = 1 + *std::max_element(points.begin(), points.end());

    std::vector<int> vpntr, vindx;
    std::vector<double> vvals;
    RuleLocal::van_matrix<effrule>(order, num_nodes, vpntr, vindx, vvals);

    std::vector<std::vector<int>> map;
    std::vector<std::vector<int>> lines1d;
    MultiIndexManipulations::resortIndexes(points, map, lines1d);

    for(int d=num_dimensions-1; d>=0; d--) {
        #pragma omp parallel for schedule(dynamic)
        for(int job = 0; job < static_cast<int>(lines1d[d].size() - 1); job++) {
            for(int i=lines1d[d][job]+1; i<lines1d[d][job+1]; i++) {
                double *row_strip = surpluses.getStrip(map[d][i]);

                int row = points.getIndex(map[d][i])[d];
                int im  = vpntr[row];
                int ijx = lines1d[d][job];
                int ix  = points.getIndex(map[d][ijx])[d];

                while(vindx[im] < row or ix < row) {
                    if (vindx[im] < ix) {
                        ++im; // move the index of the matrix pattern (missing entry)
                    } else if (ix < vindx[im]) {
                        // entry not connected, move to the next one
                        ++ijx;
                        ix = points.getIndex(map[d][ijx])[d];
                    } else {
                        double const *col_strip = surpluses.getStrip(map[d][ijx]);
                        double const v = vvals[im];
                        for(int k=0; k<num_outputs; k++)
                            row_strip[k] -= v * col_strip[k];

                        ++im;
                        ++ijx;
                        ix = points.getIndex(map[d][ijx])[d];
                    }
                }
            }
        }
    }
}